

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

void ntru_confirmation_hash(uint8_t *out,uint16_t *plaintext,uint16_t *pubkey,uint p,uint q)

{
  ssh_hash *h;
  ssh_hash *psVar1;
  ssh_hash *h4K;
  ssh_hash *h3r;
  uint8_t hashdata [64];
  ssh_hash *hconfirm;
  uint q_local;
  uint p_local;
  uint16_t *pubkey_local;
  uint16_t *plaintext_local;
  uint8_t *out_local;
  
  h = ssh_hash_new(&ssh_sha512);
  BinarySink_put_byte(h->binarysink_,'\x02');
  psVar1 = ssh_hash_new(&ssh_sha512);
  BinarySink_put_byte(psVar1->binarysink_,'\x03');
  ntru_encode_plaintext(plaintext,p,psVar1->binarysink_);
  ssh_hash_final(psVar1,(uchar *)&h3r);
  BinarySink_put_data(h->binarysink_,&h3r,0x20);
  psVar1 = ssh_hash_new(&ssh_sha512);
  BinarySink_put_byte(psVar1->binarysink_,'\x04');
  ntru_encode_pubkey(pubkey,p,q,psVar1->binarysink_);
  ssh_hash_final(psVar1,(uchar *)&h3r);
  BinarySink_put_data(h->binarysink_,&h3r,0x20);
  ssh_hash_final(h,(uchar *)&h3r);
  *(ssh_hash **)out = h3r;
  *(undefined8 *)(out + 8) = hashdata._0_8_;
  *(undefined8 *)(out + 0x10) = hashdata._8_8_;
  *(undefined8 *)(out + 0x18) = hashdata._16_8_;
  smemclr(&h3r,0x40);
  return;
}

Assistant:

void ntru_confirmation_hash(uint8_t *out, const uint16_t *plaintext,
                            const uint16_t *pubkey, unsigned p, unsigned q)
{
    /* The outer hash object */
    ssh_hash *hconfirm = ssh_hash_new(&ssh_sha512);
    put_byte(hconfirm, 2);             /* initial byte 2 */

    uint8_t hashdata[64];

    /* Compute H(3 || r) and add it to the main hash */
    ssh_hash *h3r = ssh_hash_new(&ssh_sha512);
    put_byte(h3r, 3);
    ntru_encode_plaintext(plaintext, p, BinarySink_UPCAST(h3r));
    ssh_hash_final(h3r, hashdata);
    put_data(hconfirm, hashdata, 32);

    /* Compute H(4 || K) and add it to the main hash */
    ssh_hash *h4K = ssh_hash_new(&ssh_sha512);
    put_byte(h4K, 4);
    ntru_encode_pubkey(pubkey, p, q, BinarySink_UPCAST(h4K));
    ssh_hash_final(h4K, hashdata);
    put_data(hconfirm, hashdata, 32);

    /* Compute the full output of the main SHA-512 hash */
    ssh_hash_final(hconfirm, hashdata);

    /* And copy the first 32 bytes into the caller's output array */
    memcpy(out, hashdata, 32);
    smemclr(hashdata, sizeof(hashdata));
}